

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void mp::internal::ReadBinary<mp::internal::IdentityConverter,VarCounter>
               (TextReader<fmt::Locale> *reader,NLHeader *header,VarCounter *handler,int flags)

{
  int in_ECX;
  VarCounter *in_RDX;
  NLHeader *in_RSI;
  BinaryReader<mp::internal::IdentityConverter> bin_reader;
  ReaderBase *base;
  BinaryReader<mp::internal::IdentityConverter> *in_stack_ffffffffffffff70;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_VarCounter> local_80;
  ReaderBase local_60;
  int local_1c;
  VarCounter *local_18;
  
  base = &local_60;
  local_1c = in_ECX;
  local_18 = in_RDX;
  BinaryReader<mp::internal::IdentityConverter>::BinaryReader(in_stack_ffffffffffffff70,base);
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_VarCounter>::NLReader
            (&local_80,(BinaryReader<mp::internal::IdentityConverter> *)base,in_RSI,local_18,
             local_1c);
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_VarCounter>::Read
            ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_VarCounter> *)
             in_RSI);
  BinaryReader<mp::internal::IdentityConverter>::~BinaryReader
            ((BinaryReader<mp::internal::IdentityConverter> *)0x25daa4);
  return;
}

Assistant:

void ReadBinary(TextReader<> &reader, const NLHeader &header,
                Handler &handler, int flags) {
  BinaryReader<InputConverter> bin_reader(reader);
  NLReader<BinaryReader<InputConverter>, Handler>(
        bin_reader, header, handler, flags).Read();
}